

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NodeIsTravIdCurrent(Abc_Obj_t *p)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  int in_EDX;
  
  pAVar2 = p->pNtk;
  iVar1 = p->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,in_EDX);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar2->vTravIds).nSize)) {
    return (int)((pAVar2->vTravIds).pArray[iVar1] == p->pNtk->nTravIds);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int         Abc_NodeIsTravIdCurrent( Abc_Obj_t * p )          { return (Abc_NodeTravId(p) == Abc_ObjNtk(p)->nTravIds);                                }